

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_schema_factory.hpp
# Opt level: O3

unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
validator_factory_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::get_factory_from_meta_schema
          (validator_factory_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          string_view *schema_id,evaluation_options *options,schema_store_type *schema_store_ptr,
          vector<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>,_std::allocator<std::function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_(const_jsoncons::uri_&)>_>_>
          *resolve_funcs)

{
  __node_base *p_Var1;
  size_type sVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 uVar7;
  bool bVar8;
  byte bVar9;
  pointer *__ptr;
  __buckets_ptr pp_Var10;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *member;
  value_type *this_00;
  undefined1 auVar11 [8];
  object_iterator oVar12;
  string_view str;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_00000008;
  _func_int **local_1b0;
  undefined1 local_1a8 [8];
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Tuple_impl<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_188;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> meta_sch;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  vocabulary;
  uri uri;
  
  *(undefined8 *)this = 0;
  sVar2 = (options->default_version_)._M_string_length;
  p_Var1 = &vocabulary._M_h._M_before_begin;
  local_188.
  super__Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
        )(_Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
          )this;
  vocabulary._M_h._M_buckets = &p_Var1->_M_nxt;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&vocabulary,sVar2,(options->default_version_)._M_dataplus._M_p + sVar2);
  str._M_str = (char *)vocabulary._M_h._M_buckets;
  str._M_len = vocabulary._M_h._M_bucket_count;
  jsoncons::uri::uri(&uri,str);
  if ((__node_base *)vocabulary._M_h._M_buckets != p_Var1) {
    operator_delete(vocabulary._M_h._M_buckets,
                    (ulong)((long)&(vocabulary._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
  }
  pp_Var10 = (in_stack_00000008->_M_h)._M_buckets;
  if (pp_Var10 != (__buckets_ptr)(in_stack_00000008->_M_h)._M_bucket_count) {
    do {
      jsoncons::uri::base((uri *)&vocabulary,&uri);
      if (pp_Var10[2] == (__node_base_ptr)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)pp_Var10[3])
                ((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                 &meta_sch,pp_Var10,(uri *)&vocabulary);
      if ((__node_base *)vocabulary._M_h._M_buckets != &vocabulary._M_h._M_before_begin) {
        operator_delete(vocabulary._M_h._M_buckets,
                        (ulong)((long)&(vocabulary._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
      }
      bVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                        (&meta_sch);
      if (bVar8) {
        vocabulary._M_h._M_buckets = &vocabulary._M_h._M_single_bucket;
        vocabulary._M_h._M_bucket_count = 1;
        vocabulary._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        vocabulary._M_h._M_element_count = 0;
        vocabulary._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        vocabulary._M_h._M_rehash_policy._M_next_resize = 0;
        vocabulary._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_1a0 = "$vocabulary";
        local_1a8 = (undefined1  [8])&DAT_0000000b;
        oVar12 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                 find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                  *)&meta_sch,(string_view_type *)local_1a8);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((object_range_type *)local_1a8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &meta_sch);
        if ((((undefined1  [16])oVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_198._M_local_buf[8] & 1U) == 0)) {
          if (oVar12.has_value_ != (bool)local_198._M_local_buf[8]) goto LAB_00451934;
        }
        else if (oVar12.it_._M_current._M_current !=
                 (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)local_198._M_allocated_capacity) {
LAB_00451934:
          this_00 = &(oVar12.it_._M_current._M_current)->value_;
          bVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                  is_object(this_00);
          if (bVar8) {
            basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
            object_range_abi_cxx11_
                      ((const_object_range_type *)local_1a8,
                       (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                       this_00);
            uVar7 = local_198._M_local_buf[8];
            uVar6 = local_198._M_allocated_capacity;
            bVar5 = local_1a0._0_1_;
            bVar9 = local_1a0._0_1_ & local_198._M_local_buf[8];
            auVar11 = local_1a8;
            bVar8 = local_1a0._0_1_ == (bool)local_198._M_local_buf[8];
            if ((bVar9 & 1) != 0) {
              bVar8 = local_1a8 == (undefined1  [8])local_198._M_allocated_capacity;
            }
            while (!bVar8) {
              bVar8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                      as_bool(&((key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                                 *)auVar11)->value_);
              local_1b0 = (_func_int **)CONCAT71(local_1b0._1_7_,bVar8);
              std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string_const&,bool>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,bool>,std::allocator<std::pair<std::__cxx11::string_const,bool>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&vocabulary,auVar11,&local_1b0);
              auVar11 = (undefined1  [8])((long)auVar11 + 0x30);
              bVar8 = auVar11 == (undefined1  [8])uVar6;
              if ((bVar9 & 1) == 0) {
                bVar8 = bVar5 == (bool)uVar7;
              }
            }
          }
        }
        local_1a0 = "$schema";
        local_1a8 = (undefined1  [8])0x7;
        oVar12 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                 find_abi_cxx11_((basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>
                                  *)&meta_sch,(string_view_type *)local_1a8);
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        object_range_abi_cxx11_
                  ((object_range_type *)local_1a8,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &meta_sch);
        if ((((undefined1  [16])oVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) ||
           ((local_198._M_local_buf[8] & 1U) == 0)) {
          bVar8 = oVar12.has_value_ == (bool)local_198._M_local_buf[8];
        }
        else {
          bVar8 = oVar12.it_._M_current._M_current ==
                  (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                   *)local_198._M_allocated_capacity;
        }
        if (bVar8) {
          bVar8 = false;
        }
        else {
          _local_1a8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                       as_string_view(&(oVar12.it_._M_current._M_current)->value_);
          get_factory((validator_factory_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)&local_1b0,sch,schema_id,(evaluation_options *)local_1a8,schema_store_ptr,
                      resolve_funcs,in_stack_00000008);
          pp_Var4 = local_1b0;
          local_1b0 = (_func_int **)0x0;
          pp_Var3 = *(_func_int ***)
                     local_188.
                     super__Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
                     ._M_head_impl;
          *(_func_int ***)
           local_188.
           super__Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl = pp_Var4;
          if ((pp_Var3 != (_func_int **)0x0) &&
             ((**(code **)(*pp_Var3 + 8))(), local_1b0 != (_func_int **)0x0)) {
            (**(code **)(*local_1b0 + 8))();
          }
          bVar8 = true;
        }
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&vocabulary._M_h);
      }
      else {
        bVar8 = false;
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::destroy(&meta_sch)
      ;
      pp_Var10 = pp_Var10 + 4;
    } while (pp_Var10 != (__buckets_ptr)(in_stack_00000008->_M_h)._M_bucket_count && !bVar8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)uri.uri_string_._M_dataplus._M_p != &uri.uri_string_.field_2) {
    operator_delete(uri.uri_string_._M_dataplus._M_p,
                    uri.uri_string_.field_2._M_allocated_capacity + 1);
  }
  return (unique_ptr<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          )local_188.
           super__Head_base<0UL,_jsoncons::jsonschema::schema_validator_factory_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
           ._M_head_impl._M_head_impl;
}

Assistant:

std::unique_ptr<schema_validator_factory_base<Json>> get_factory_from_meta_schema(Json&& sch, const jsoncons::string_view& schema_id,
            const evaluation_options& options, schema_store_type* schema_store_ptr,
            const std::vector<resolve_uri_type<Json>>& resolve_funcs) const
        {
            std::unique_ptr<schema_validator_factory_base<Json>> factory;

            bool found = false;
            jsoncons::uri uri{ std::string(schema_id) };
            for (auto it = resolve_funcs.begin(); it != resolve_funcs.end() && !found; ++it)
            {
                Json meta_sch = (*it)(uri.base());
                if (meta_sch.is_object())
                {
                    std::unordered_map<std::string,bool> vocabulary;
                    auto vocab_it = meta_sch.find("$vocabulary");
                    if (vocab_it != meta_sch.object_range().end())
                    {
                        const auto& vocab = (*vocab_it).value();
                        if (vocab.is_object())
                        {
                            for (const auto& member : vocab.object_range())
                            {
                                vocabulary.emplace(member.key(), member.value().as_bool());
                            }
                        }
                    }
                    auto schema_it = meta_sch.find("$schema");
                    if (schema_it != meta_sch.object_range().end())
                    {
                        factory = get_factory(std::move(sch), (*schema_it).value().as_string_view(), options, schema_store_ptr, resolve_funcs, vocabulary);
                        found = true;
                    }
                }
            }
            
            return factory;
        }